

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorOperations.hpp
# Opt level: O2

shared_ptr<helics::TranslatorOperator> __thiscall
helics::JsonTranslatorOperation::getOperator(JsonTranslatorOperation *this)

{
  shared_ptr<helics::TranslatorOperator> sVar1;
  
  sVar1 = std::static_pointer_cast<helics::TranslatorOperator,helics::JsonTranslatorOperator>
                    ((shared_ptr<helics::JsonTranslatorOperator> *)this);
  sVar1.super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<helics::TranslatorOperator>)
         sVar1.super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<TranslatorOperator> getOperator() override
    {
        return std::static_pointer_cast<TranslatorOperator>(to);
    }